

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_compilation_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  undefined1 *puVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  LayoutBindingProgram *pLVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  String local_ac0;
  String local_aa0;
  LayoutBindingProgramAutoPtr local_a80;
  LayoutBindingProgramAutoPtr program_4;
  undefined1 local_a58 [8];
  StringStream s_1;
  String local_8c0;
  allocator<char> local_899;
  string local_898 [32];
  string local_878 [32];
  String local_858;
  string local_838 [32];
  String local_818;
  allocator<char> local_7f1;
  String local_7f0;
  String local_7d0;
  allocator<char> local_7a9;
  String local_7a8;
  String local_788;
  String local_768;
  LayoutBindingProgramAutoPtr local_748;
  LayoutBindingProgramAutoPtr program_3;
  String local_720;
  allocator<char> local_6f9;
  string local_6f8 [32];
  string local_6d8 [32];
  String local_6b8;
  string local_698 [32];
  String local_678;
  allocator<char> local_651;
  String local_650;
  String local_630;
  allocator<char> local_609;
  String local_608;
  String local_5e8;
  String local_5c8;
  LayoutBindingProgramAutoPtr local_5a8;
  LayoutBindingProgramAutoPtr program_2;
  String local_580;
  allocator<char> local_559;
  string local_558 [32];
  string local_538 [32];
  String local_518;
  string local_4f8 [32];
  String local_4d8;
  allocator<char> local_4b1;
  String local_4b0;
  allocator<char> local_489;
  string local_488 [32];
  String local_468;
  allocator<char> local_441;
  String local_440;
  String local_420;
  String local_400;
  LayoutBindingProgramAutoPtr local_3e0;
  LayoutBindingProgramAutoPtr program_1;
  String local_3b8;
  allocator<char> local_391;
  string local_390 [32];
  string local_370 [32];
  String local_350;
  string local_330 [32];
  String local_310;
  allocator<char> local_2e9;
  String local_2e8;
  allocator<char> local_2c1;
  string local_2c0 [32];
  String local_2a0;
  allocator<char> local_279;
  String local_278;
  String local_258;
  uint local_234;
  String local_230;
  LayoutBindingProgramAutoPtr local_210;
  LayoutBindingProgramAutoPtr program;
  String local_1e8;
  undefined1 local_1b8 [8];
  StringStream s;
  String decl;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  std::__cxx11::string::string((string *)&s.super_ostringstream.field_0x170);
  StringStream::StringStream((StringStream *)local_1b8);
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  poVar7 = std::operator<<((ostream *)local_1b8,*(char **)(CONCAT44(extraout_var,iVar5) + 0x10));
  std::operator<<(poVar7,"(0.0);");
  std::__cxx11::ostringstream::str();
  setTemplateParam(this,"UNIFORM_ACCESS",&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  StringStream::reset((StringStream *)local_1b8);
  poVar7 = std::operator<<((ostream *)local_1b8,"layout(binding=0) ");
  std::operator<<(poVar7,"uniform float tex0;");
  std::__cxx11::ostringstream::str();
  setTemplateParam(this,"UNIFORM_DECL",(String *)&program);
  std::__cxx11::string::~string((string *)&program);
  updateTemplate(this);
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
            (&local_210,&this->super_IProgramContextSupplier);
  pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_210);
  bVar3 = LayoutBindingProgram::compiledAndLinked(pLVar8);
  bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
  if (!bVar3) {
    pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_210);
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_230,pLVar8,true);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar3,&local_230,false);
    std::__cxx11::string::~string((string *)&local_230);
  }
  local_234 = (uint)!bVar3;
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_210);
  StringStream::~StringStream((StringStream *)local_1b8);
  if (local_234 == 0) {
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar2 = *(char **)CONCAT44(extraout_var_00,iVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar2,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2c0,"0.0",&local_2c1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
              (&local_2a0,this,local_2c0);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar2 = *(char **)(CONCAT44(extraout_var_01,iVar5) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar2,&local_2e9);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_330,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_310,this,local_330);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_370,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_390,"float",&local_391);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_350,this,local_370,local_390);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_3b8,this,0);
    std::__cxx11::string::string((string *)&program_1);
    buildUniformDecl(&local_258,this,&local_278,&local_2a0,&local_2e8,&local_310,&local_350,
                     &local_3b8,(String *)&program_1);
    puVar1 = &s.super_ostringstream.field_0x170;
    std::__cxx11::string::operator=((string *)puVar1,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&program_1);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator(&local_391);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    setTemplateParam(this,"UNIFORM_DECL",(String *)puVar1);
    updateTemplate(this);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_3e0,&this->super_IProgramContextSupplier);
    pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3e0);
    bVar4 = LayoutBindingProgram::compiledAndLinked(pLVar8);
    bVar3 = (bVar3 & (bVar4 ^ 0xffU) & 1) != 0;
    if (!bVar3) {
      pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3e0);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_400,pLVar8,true);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar3,&local_400,false);
      std::__cxx11::string::~string((string *)&local_400);
    }
    local_234 = (uint)!bVar3;
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3e0);
    if (local_234 == 0) {
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
      pcVar2 = *(char **)CONCAT44(extraout_var_02,iVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,pcVar2,&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_488,"-1",&local_489);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
                (&local_468,this,local_488);
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
      pcVar2 = *(char **)(CONCAT44(extraout_var_03,iVar5) + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,pcVar2,&local_4b1);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_4f8,this,0)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_4d8,this,local_4f8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_538,this,0)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_558,"float",&local_559);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_518,this,local_538,local_558);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_580,this,0);
      std::__cxx11::string::string((string *)&program_2);
      buildUniformDecl(&local_420,this,&local_440,&local_468,&local_4b0,&local_4d8,&local_518,
                       &local_580,(String *)&program_2);
      puVar1 = &s.super_ostringstream.field_0x170;
      std::__cxx11::string::operator=((string *)puVar1,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&program_2);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator(&local_559);
      std::__cxx11::string::~string(local_538);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string(local_4f8);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string(local_488);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      setTemplateParam(this,"UNIFORM_DECL",(String *)puVar1);
      updateTemplate(this);
      LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                (&local_5a8,&this->super_IProgramContextSupplier);
      pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_5a8);
      bVar4 = LayoutBindingProgram::compiledAndLinked(pLVar8);
      bVar3 = (bVar3 & (bVar4 ^ 0xffU) & 1) != 0;
      if (!bVar3) {
        pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_5a8);
        LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_5c8,pLVar8,true);
        LayoutBindingTestResult::LayoutBindingTestResult
                  (__return_storage_ptr__,bVar3,&local_5c8,false);
        std::__cxx11::string::~string((string *)&local_5c8);
      }
      local_234 = (uint)!bVar3;
      LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_5a8);
      if (local_234 == 0) {
        iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
        pcVar2 = *(char **)CONCAT44(extraout_var_04,iVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,pcVar2,&local_609);
        uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                  (&local_630,this,(ulong)uVar6);
        iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
        pcVar2 = *(char **)(CONCAT44(extraout_var_05,iVar5) + 0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,pcVar2,&local_651);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (local_698,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_678,this,local_698);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (local_6d8,this,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_6f8,"float",&local_6f9);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                  (&local_6b8,this,local_6d8,local_6f8);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_720,this,0);
        std::__cxx11::string::string((string *)&program_3);
        buildUniformDecl(&local_5e8,this,&local_608,&local_630,&local_650,&local_678,&local_6b8,
                         &local_720,(String *)&program_3);
        puVar1 = &s.super_ostringstream.field_0x170;
        std::__cxx11::string::operator=((string *)puVar1,(string *)&local_5e8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::__cxx11::string::~string((string *)&program_3);
        std::__cxx11::string::~string((string *)&local_720);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string(local_6f8);
        std::allocator<char>::~allocator(&local_6f9);
        std::__cxx11::string::~string(local_6d8);
        std::__cxx11::string::~string((string *)&local_678);
        std::__cxx11::string::~string(local_698);
        std::__cxx11::string::~string((string *)&local_650);
        std::allocator<char>::~allocator(&local_651);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_608);
        std::allocator<char>::~allocator(&local_609);
        setTemplateParam(this,"UNIFORM_DECL",(String *)puVar1);
        updateTemplate(this);
        LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                  (&local_748,&this->super_IProgramContextSupplier);
        pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_748);
        bVar4 = LayoutBindingProgram::compiledAndLinked(pLVar8);
        bVar3 = (bVar3 & (bVar4 ^ 0xffU) & 1) != 0;
        if (!bVar3) {
          pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_748);
          LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_768,pLVar8,true);
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,bVar3,&local_768,false);
          std::__cxx11::string::~string((string *)&local_768);
        }
        local_234 = (uint)!bVar3;
        LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_748);
        if (local_234 == 0) {
          iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
          pcVar2 = *(char **)CONCAT44(extraout_var_06,iVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,pcVar2,&local_7a9)
          ;
          uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                    (&local_7d0,this,(ulong)uVar6);
          iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
          pcVar2 = *(char **)(CONCAT44(extraout_var_07,iVar5) + 0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,pcVar2,&local_7f1)
          ;
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (local_838,this,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                    (&local_818,this,local_838);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (local_878,this,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_898,"float",&local_899);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                    (&local_858,this,local_878,local_898);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (&local_8c0,this,0);
          puVar1 = &s_1.super_ostringstream.field_0x170;
          std::__cxx11::string::string((string *)puVar1);
          buildUniformDecl(&local_788,this,&local_7a8,&local_7d0,&local_7f0,&local_818,&local_858,
                           &local_8c0,(String *)puVar1);
          puVar1 = &s.super_ostringstream.field_0x170;
          std::__cxx11::string::operator=((string *)puVar1,(string *)&local_788);
          std::__cxx11::string::~string((string *)&local_788);
          std::__cxx11::string::~string((string *)&s_1.super_ostringstream.field_0x170);
          std::__cxx11::string::~string((string *)&local_8c0);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string(local_898);
          std::allocator<char>::~allocator(&local_899);
          std::__cxx11::string::~string(local_878);
          std::__cxx11::string::~string((string *)&local_818);
          std::__cxx11::string::~string(local_838);
          std::__cxx11::string::~string((string *)&local_7f0);
          std::allocator<char>::~allocator(&local_7f1);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator(&local_7a9);
          setTemplateParam(this,"UNIFORM_DECL",(String *)puVar1);
          StringStream::StringStream((StringStream *)local_a58);
          std::operator<<((ostream *)local_a58,"vec4(0.0);\n");
          std::__cxx11::ostringstream::str();
          setTemplateParam(this,"UNIFORM_ACCESS",(String *)&program_4);
          std::__cxx11::string::~string((string *)&program_4);
          updateTemplate(this);
          LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                    (&local_a80,&this->super_IProgramContextSupplier);
          pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_a80);
          bVar4 = LayoutBindingProgram::compiledAndLinked(pLVar8);
          bVar3 = (bVar3 & (bVar4 ^ 0xffU) & 1) != 0;
          if (!bVar3) {
            pLVar8 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_a80);
            LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_aa0,pLVar8,true);
            LayoutBindingTestResult::LayoutBindingTestResult
                      (__return_storage_ptr__,bVar3,&local_aa0,false);
            std::__cxx11::string::~string((string *)&local_aa0);
          }
          local_234 = (uint)!bVar3;
          LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr
                    (&local_a80);
          StringStream::~StringStream((StringStream *)local_a58);
          if (local_234 == 0) {
            std::__cxx11::string::string((string *)&local_ac0);
            LayoutBindingTestResult::LayoutBindingTestResult
                      (__return_storage_ptr__,bVar3,&local_ac0,false);
            std::__cxx11::string::~string((string *)&local_ac0);
            local_234 = 1;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&s.super_ostringstream.field_0x170);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_compilation_errors(void)
{
	bool   passed = true;
	String decl;

	// verify "uniform float var;" doesn't compile
	{
		StringStream s;
		s << getTestParameters().vector_type << "(0.0);";

		setTemplateParam("UNIFORM_ACCESS", s.str());
		s.reset();
		s << "layout(binding=0) "
		  << "uniform float tex0;";
		setTemplateParam("UNIFORM_DECL", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	// verify that non-constant integer expression in binding fails
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("0.0")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("-1")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		s << "vec4(0.0);\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	return LayoutBindingTestResult(passed, String());
}